

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2Impl::addCanonIterPropertyStarts
          (Normalizer2Impl *this,USetAdder *sa,UErrorCode *errorCode)

{
  UBool UVar1;
  uint32_t local_2c;
  int local_28;
  uint32_t value;
  UChar32 end;
  UChar32 start;
  UErrorCode *errorCode_local;
  USetAdder *sa_local;
  Normalizer2Impl *this_local;
  
  _end = errorCode;
  errorCode_local = (UErrorCode *)sa;
  sa_local = (USetAdder *)this;
  UVar1 = ensureCanonIterData(this,errorCode);
  if (UVar1 != '\0') {
    value = 0;
    while (local_28 = ucptrie_getRange_63(this->fCanonIterData->trie,value,UCPMAP_RANGE_NORMAL,0,
                                          segmentStarterMapper,(void *)0x0,&local_2c), -1 < local_28
          ) {
      (**(code **)(errorCode_local + 2))(*(undefined8 *)errorCode_local,value);
      value = local_28 + 1;
    }
  }
  return;
}

Assistant:

void
Normalizer2Impl::addCanonIterPropertyStarts(const USetAdder *sa, UErrorCode &errorCode) const {
    // Add the start code point of each same-value range of the canonical iterator data trie.
    if (!ensureCanonIterData(errorCode)) { return; }
    // Currently only used for the SEGMENT_STARTER property.
    UChar32 start = 0, end;
    uint32_t value;
    while ((end = ucptrie_getRange(fCanonIterData->trie, start, UCPMAP_RANGE_NORMAL, 0,
                                   segmentStarterMapper, nullptr, &value)) >= 0) {
        sa->add(sa->set, start);
        start = end + 1;
    }
}